

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_encoder.cc
# Opt level: O0

bool __thiscall
draco::KdTreeAttributesEncoder::EncodePortableAttributes
          (KdTreeAttributesEncoder *this,EncoderBuffer *out_buffer)

{
  PointDVectorIterator begin;
  PointDVectorIterator begin_00;
  PointDVectorIterator begin_01;
  PointDVectorIterator begin_02;
  PointDVectorIterator begin_03;
  PointDVectorIterator begin_04;
  PointDVectorIterator begin_05;
  PointDVectorIterator end;
  PointDVectorIterator end_00;
  PointDVectorIterator end_01;
  PointDVectorIterator end_02;
  PointDVectorIterator end_03;
  PointDVectorIterator end_04;
  PointDVectorIterator end_05;
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint32_t uVar4;
  DataType DVar5;
  int iVar6;
  PointCloudEncoder *pPVar7;
  int *piVar8;
  PointCloud *this_00;
  reference pvVar9;
  reference pvVar10;
  uint *puVar11;
  AttributesEncoder *in_RDI;
  DynamicIntegerPointsKdTreeEncoder<0> points_encoder_6;
  DynamicIntegerPointsKdTreeEncoder<1> points_encoder_5;
  DynamicIntegerPointsKdTreeEncoder<2> points_encoder_4;
  DynamicIntegerPointsKdTreeEncoder<3> points_encoder_3;
  DynamicIntegerPointsKdTreeEncoder<4> points_encoder_2;
  DynamicIntegerPointsKdTreeEncoder<5> points_encoder_1;
  DynamicIntegerPointsKdTreeEncoder<6> points_encoder;
  int msb;
  int i_1;
  uint32_t *data;
  int num_bits;
  AttributeValueIndex avi_2;
  PointIndex pi_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> point;
  int c;
  AttributeValueIndex avi_1;
  PointIndex pi_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_point;
  vector<int,_std::allocator<int>_> signed_point;
  uint8_t *att_value_address;
  AttributeValueIndex avi;
  PointIndex pi;
  PointAttribute *source_att;
  PointAttribute *att;
  int att_id;
  uint32_t i;
  int num_processed_signed_components;
  int num_processed_quantized_attributes;
  int num_processed_components;
  PointDVector<unsigned_int> point_vector;
  int num_points;
  uint8_t compression_level;
  PointAttribute *in_stack_ffffffffffffdf08;
  PointCloud *in_stack_ffffffffffffdf10;
  GeometryAttribute *in_stack_ffffffffffffdf18;
  PointDVector<unsigned_int> *in_stack_ffffffffffffdf20;
  size_type in_stack_ffffffffffffdf28;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffdf30;
  uint32_t in_stack_ffffffffffffdf38;
  uint32_t in_stack_ffffffffffffdf3c;
  undefined1 in_stack_ffffffffffffdf40;
  undefined1 in_stack_ffffffffffffdf41;
  undefined1 in_stack_ffffffffffffdf42;
  undefined1 in_stack_ffffffffffffdf43;
  undefined1 in_stack_ffffffffffffdf44;
  undefined1 in_stack_ffffffffffffdf45;
  undefined1 in_stack_ffffffffffffdf46;
  undefined1 in_stack_ffffffffffffdf47;
  PointAttribute *in_stack_ffffffffffffdf78;
  AttributeValueIndex in_stack_ffffffffffffdf80;
  undefined4 in_stack_ffffffffffffdf84;
  DynamicIntegerPointsKdTreeEncoder<6> *in_stack_ffffffffffffdf88;
  undefined6 in_stack_ffffffffffffdf98;
  undefined1 in_stack_ffffffffffffdf9e;
  undefined1 in_stack_ffffffffffffdf9f;
  uint in_stack_ffffffffffffdfa0;
  int in_stack_ffffffffffffdfa4;
  uint in_stack_ffffffffffffdfa8;
  undefined4 in_stack_ffffffffffffdfac;
  value_type in_stack_ffffffffffffdfb0;
  value_type in_stack_ffffffffffffdfb4;
  int in_stack_ffffffffffffdfb8;
  undefined4 in_stack_ffffffffffffdfbc;
  PointAttribute *in_stack_ffffffffffffdfc0;
  AttributeValueIndex in_stack_ffffffffffffdfc8;
  undefined4 in_stack_ffffffffffffdfcc;
  DataType in_stack_ffffffffffffe02c;
  DataType in_stack_ffffffffffffe030;
  DataType in_stack_ffffffffffffe034;
  DynamicIntegerPointsKdTreeEncoder<0> *pDStack_1f60;
  DynamicIntegerPointsKdTreeEncoder<1> *pDStack_1e20;
  DynamicIntegerPointsKdTreeEncoder<2> *pDStack_1ce0;
  DynamicIntegerPointsKdTreeEncoder<3> *pDStack_1b88;
  DynamicIntegerPointsKdTreeEncoder<4> *pDStack_1a30;
  DynamicIntegerPointsKdTreeEncoder<5> *pDStack_11d8;
  DynamicIntegerPointsKdTreeEncoder<6> *pDStack_980;
  int local_14c;
  int local_13c;
  ValueType local_12c;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_128 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  int local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  ValueType local_f4;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_f0 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  vector<int,_std::allocator<int>_> local_c8;
  uint local_ac;
  uint8_t *local_a8;
  uint local_9c;
  uint local_98;
  ValueType local_94;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_90;
  int local_8c;
  PointAttribute *local_88;
  PointAttribute *local_80;
  int32_t local_78;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  PointDVector<unsigned_int> local_58;
  ValueType local_28;
  int local_24;
  int local_20;
  char local_19;
  byte local_1;
  
  pPVar7 = AttributesEncoder::encoder(in_RDI);
  PointCloudEncoder::options(pPVar7);
  local_20 = EncoderOptionsBase<int>::GetSpeed
                       ((EncoderOptionsBase<int> *)
                        CONCAT17(in_stack_ffffffffffffdf9f,
                                 CONCAT16(in_stack_ffffffffffffdf9e,in_stack_ffffffffffffdf98)));
  local_20 = 10 - local_20;
  local_24 = 6;
  piVar8 = std::min<int>(&local_20,&local_24);
  local_19 = (char)*piVar8;
  if ((local_19 == '\x06') && (0xf < *(int *)&in_RDI[2]._vptr_AttributesEncoder)) {
    local_19 = '\x05';
  }
  EncoderBuffer::Encode<unsigned_char>
            ((EncoderBuffer *)CONCAT44(in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38),
             (uchar *)in_stack_ffffffffffffdf30);
  pPVar7 = AttributesEncoder::encoder(in_RDI);
  this_00 = PointCloudEncoder::point_cloud(pPVar7);
  local_28 = PointCloud::num_points(this_00);
  PointDVector<unsigned_int>::PointDVector
            ((PointDVector<unsigned_int> *)
             CONCAT17(in_stack_ffffffffffffdf47,
                      CONCAT16(in_stack_ffffffffffffdf46,
                               CONCAT15(in_stack_ffffffffffffdf45,
                                        CONCAT14(in_stack_ffffffffffffdf44,
                                                 CONCAT13(in_stack_ffffffffffffdf43,
                                                          CONCAT12(in_stack_ffffffffffffdf42,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffdf41,
                                                  in_stack_ffffffffffffdf40))))))),
             in_stack_ffffffffffffdf3c,in_stack_ffffffffffffdf38);
  local_5c = 0;
  local_60 = 0;
  local_64 = 0;
  for (local_68 = 0; uVar1 = local_68,
      uVar4 = AttributesEncoder::num_attributes((AttributesEncoder *)0x223e3f), uVar1 < uVar4;
      local_68 = local_68 + 1) {
    local_78 = AttributesEncoder::GetAttributeId
                         ((AttributesEncoder *)in_stack_ffffffffffffdf10,
                          (int)((ulong)in_stack_ffffffffffffdf08 >> 0x20));
    pPVar7 = AttributesEncoder::encoder(in_RDI);
    PointCloudEncoder::point_cloud(pPVar7);
    local_80 = PointCloud::attribute
                         (in_stack_ffffffffffffdf10,
                          (int32_t)((ulong)in_stack_ffffffffffffdf08 >> 0x20));
    local_88 = (PointAttribute *)0x0;
    DVar5 = GeometryAttribute::data_type(&local_80->super_GeometryAttribute);
    if (((((DVar5 == DT_UINT32) ||
          (DVar5 = GeometryAttribute::data_type(&local_80->super_GeometryAttribute),
          DVar5 == DT_UINT16)) ||
         (DVar5 = GeometryAttribute::data_type(&local_80->super_GeometryAttribute),
         DVar5 == DT_UINT8)) ||
        ((DVar5 = GeometryAttribute::data_type(&local_80->super_GeometryAttribute),
         DVar5 == DT_INT32 ||
         (in_stack_ffffffffffffe034 =
               GeometryAttribute::data_type(&local_80->super_GeometryAttribute),
         in_stack_ffffffffffffe034 == DT_INT16)))) ||
       (in_stack_ffffffffffffe030 = GeometryAttribute::data_type(&local_80->super_GeometryAttribute)
       , in_stack_ffffffffffffe030 == DT_INT8)) {
      local_88 = local_80;
    }
    else {
      in_stack_ffffffffffffe02c = GeometryAttribute::data_type(&local_80->super_GeometryAttribute);
      if (in_stack_ffffffffffffe02c != DT_FLOAT32) {
        local_1 = 0;
        local_8c = 1;
        goto LAB_002251b1;
      }
      std::
      vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
      ::operator[]((vector<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                    *)&in_RDI[1].point_attribute_to_local_id_map_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_end_of_storage,(long)local_60);
      local_88 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ::get((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                        *)in_stack_ffffffffffffdf10);
      local_60 = local_60 + 1;
    }
    if (local_88 == (PointAttribute *)0x0) {
      local_1 = 0;
      local_8c = 1;
      goto LAB_002251b1;
    }
    DVar5 = GeometryAttribute::data_type(&local_88->super_GeometryAttribute);
    if (DVar5 == DT_UINT32) {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_90,0);
      while( true ) {
        local_94 = local_28;
        bVar2 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<(&local_90,&local_94)
        ;
        if (!bVar2) break;
        local_9c = local_90.value_;
        local_ac = (uint)PointAttribute::mapped_index
                                   (in_stack_ffffffffffffdf08,
                                    (PointIndex)(uint)in_stack_ffffffffffffdf10);
        local_98 = local_ac;
        local_a8 = GeometryAttribute::GetAddress
                             (in_stack_ffffffffffffdf18,
                              (AttributeValueIndex)(uint)((ulong)in_stack_ffffffffffffdf20 >> 0x20))
        ;
        GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(&local_90);
        PointDVector<unsigned_int>::CopyAttribute
                  (in_stack_ffffffffffffdf20,(uint)((ulong)in_stack_ffffffffffffdf18 >> 0x20),
                   (uint)in_stack_ffffffffffffdf18,(uint)((ulong)in_stack_ffffffffffffdf10 >> 0x20),
                   in_stack_ffffffffffffdf08);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_90);
      }
    }
    else {
      DVar5 = GeometryAttribute::data_type(&local_88->super_GeometryAttribute);
      if (((DVar5 == DT_INT32) ||
          (DVar5 = GeometryAttribute::data_type(&local_88->super_GeometryAttribute),
          DVar5 == DT_INT16)) ||
         (DVar5 = GeometryAttribute::data_type(&local_88->super_GeometryAttribute), DVar5 == DT_INT8
         )) {
        GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
        std::allocator<int>::allocator((allocator<int> *)0x2242b1);
        std::vector<int,_std::allocator<int>_>::vector
                  (in_stack_ffffffffffffdf30,in_stack_ffffffffffffdf28,
                   (allocator_type *)in_stack_ffffffffffffdf20);
        std::allocator<int>::~allocator((allocator<int> *)0x2242dd);
        GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x22431a);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdf30,
                   in_stack_ffffffffffffdf28,(allocator_type *)in_stack_ffffffffffffdf20);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x224346);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(local_f0,0);
        while( true ) {
          local_f4 = local_28;
          bVar2 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<
                            (local_f0,&local_f4);
          in_stack_ffffffffffffdfcc = CONCAT13(bVar2,(int3)in_stack_ffffffffffffdfcc);
          if (!bVar2) break;
          local_fc = local_f0[0].value_;
          in_stack_ffffffffffffdfc8 =
               PointAttribute::mapped_index
                         (in_stack_ffffffffffffdf08,(uint)in_stack_ffffffffffffdf10);
          in_stack_ffffffffffffdfc0 = local_88;
          local_100 = in_stack_ffffffffffffdfc8.value_;
          local_f8 = in_stack_ffffffffffffdfc8.value_;
          std::vector<int,_std::allocator<int>_>::operator[](&local_c8,0);
          GeometryAttribute::ConvertValue<int>
                    (in_stack_ffffffffffffdf18,
                     (AttributeValueIndex)(uint)((ulong)in_stack_ffffffffffffdf20 >> 0x20),
                     (int *)in_stack_ffffffffffffdf10);
          local_104 = 0;
          while( true ) {
            in_stack_ffffffffffffdfb8 = local_104;
            bVar3 = GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
            in_stack_ffffffffffffdfbc = CONCAT13(bVar3,(int3)in_stack_ffffffffffffdfbc);
            if ((int)(uint)bVar3 <= in_stack_ffffffffffffdfb8) break;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&local_c8,(long)local_104);
            in_stack_ffffffffffffdfb0 = *pvVar9;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                &in_RDI[1].point_attribute_ids_.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                                (long)(local_64 + local_104));
            in_stack_ffffffffffffdfb4 = in_stack_ffffffffffffdfb0 - *pvVar9;
            pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&local_e8,(long)local_104);
            *pvVar10 = in_stack_ffffffffffffdfb4;
            local_104 = local_104 + 1;
          }
          bVar3 = GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
          in_stack_ffffffffffffdfac = CONCAT13(bVar3,(int3)in_stack_ffffffffffffdfac);
          in_stack_ffffffffffffdfa0 = (uint)bVar3;
          in_stack_ffffffffffffdfa4 = local_5c;
          in_stack_ffffffffffffdfa8 =
               IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(local_f0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_e8,0);
          PointDVector<unsigned_int>::CopyAttribute
                    (in_stack_ffffffffffffdf20,(uint)((ulong)in_stack_ffffffffffffdf18 >> 0x20),
                     (uint)in_stack_ffffffffffffdf18,
                     (uint)((ulong)in_stack_ffffffffffffdf10 >> 0x20),in_stack_ffffffffffffdf08);
          IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(local_f0);
        }
        bVar3 = GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
        local_64 = (uint)bVar3 + local_64;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdf20)
        ;
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffdf20);
      }
      else {
        bVar3 = GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
        in_stack_ffffffffffffdf88 = (DynamicIntegerPointsKdTreeEncoder<6> *)(ulong)bVar3;
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2246a5);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdf30,
                   in_stack_ffffffffffffdf28,(allocator_type *)in_stack_ffffffffffffdf20);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x2246d1);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(local_128,0);
        while( true ) {
          local_12c = local_28;
          bVar2 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<
                            (local_128,&local_12c);
          in_stack_ffffffffffffdf84 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffdf84);
          if (!bVar2) break;
          in_stack_ffffffffffffdf80 =
               PointAttribute::mapped_index
                         (in_stack_ffffffffffffdf08,(uint)in_stack_ffffffffffffdf10);
          in_stack_ffffffffffffdf78 = local_88;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_120,0);
          GeometryAttribute::ConvertValue<unsigned_int>
                    (in_stack_ffffffffffffdf18,
                     (AttributeValueIndex)(uint)((ulong)in_stack_ffffffffffffdf20 >> 0x20),
                     (uint *)in_stack_ffffffffffffdf10);
          GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
          IndexType<unsigned_int,_draco::PointIndex_tag_type_>::value(local_128);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2247d8);
          PointDVector<unsigned_int>::CopyAttribute
                    (in_stack_ffffffffffffdf20,(uint)((ulong)in_stack_ffffffffffffdf18 >> 0x20),
                     (uint)in_stack_ffffffffffffdf18,
                     (uint)((ulong)in_stack_ffffffffffffdf10 >> 0x20),in_stack_ffffffffffffdf08);
          IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(local_128);
        }
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffdf20)
        ;
      }
    }
    bVar3 = GeometryAttribute::num_components(&local_88->super_GeometryAttribute);
    local_5c = (uint)bVar3 + local_5c;
  }
  local_13c = 0;
  puVar11 = PointDVector<unsigned_int>::operator[](&local_58,0);
  for (local_14c = 0; local_14c < (int)(local_28 * *(int *)&in_RDI[2]._vptr_AttributesEncoder);
      local_14c = local_14c + 1) {
    if (puVar11[local_14c] != 0) {
      iVar6 = MostSignificantBit(puVar11[local_14c]);
      if (local_13c < iVar6 + 1) {
        local_13c = iVar6 + 1;
      }
    }
  }
  switch(local_19) {
  case '\0':
    DynamicIntegerPointsKdTreeEncoder<0>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<0> *)
               CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030),
               in_stack_ffffffffffffe02c);
    PointDVector<unsigned_int>::begin((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    PointDVector<unsigned_int>::end((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    begin_05.item_._4_4_ = in_stack_ffffffffffffdfa4;
    begin_05.item_._0_4_ = in_stack_ffffffffffffdfa0;
    begin_05.vec_._0_4_ = in_stack_ffffffffffffdfa8;
    begin_05.vec_._4_4_ = in_stack_ffffffffffffdfac;
    begin_05.dimensionality_ = in_stack_ffffffffffffdfb0;
    begin_05._20_4_ = in_stack_ffffffffffffdfb4;
    end_05.item_._4_4_ = in_stack_ffffffffffffdfbc;
    end_05.item_._0_4_ = in_stack_ffffffffffffdfb8;
    end_05.vec_ = (PointDVector<unsigned_int> *)in_stack_ffffffffffffdfc0;
    end_05.dimensionality_ = in_stack_ffffffffffffdfc8.value_;
    end_05._20_4_ = in_stack_ffffffffffffdfcc;
    bVar2 = DynamicIntegerPointsKdTreeEncoder<0>::
            EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      ((DynamicIntegerPointsKdTreeEncoder<0> *)in_stack_ffffffffffffdf88,begin_05,
                       end_05,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80.value_),
                       (EncoderBuffer *)in_stack_ffffffffffffdf78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8c = 0x14;
    }
    else {
      local_1 = 0;
      local_8c = 1;
    }
    DynamicIntegerPointsKdTreeEncoder<0>::~DynamicIntegerPointsKdTreeEncoder(pDStack_1f60);
    break;
  case '\x01':
    DynamicIntegerPointsKdTreeEncoder<1>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<1> *)
               CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030),
               in_stack_ffffffffffffe02c);
    PointDVector<unsigned_int>::begin((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    PointDVector<unsigned_int>::end((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    begin_04.item_._4_4_ = in_stack_ffffffffffffdfa4;
    begin_04.item_._0_4_ = in_stack_ffffffffffffdfa0;
    begin_04.vec_._0_4_ = in_stack_ffffffffffffdfa8;
    begin_04.vec_._4_4_ = in_stack_ffffffffffffdfac;
    begin_04.dimensionality_ = in_stack_ffffffffffffdfb0;
    begin_04._20_4_ = in_stack_ffffffffffffdfb4;
    end_04.item_._4_4_ = in_stack_ffffffffffffdfbc;
    end_04.item_._0_4_ = in_stack_ffffffffffffdfb8;
    end_04.vec_ = (PointDVector<unsigned_int> *)in_stack_ffffffffffffdfc0;
    end_04.dimensionality_ = in_stack_ffffffffffffdfc8.value_;
    end_04._20_4_ = in_stack_ffffffffffffdfcc;
    bVar2 = DynamicIntegerPointsKdTreeEncoder<1>::
            EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      ((DynamicIntegerPointsKdTreeEncoder<1> *)in_stack_ffffffffffffdf88,begin_04,
                       end_04,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80.value_),
                       (EncoderBuffer *)in_stack_ffffffffffffdf78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8c = 0x14;
    }
    else {
      local_1 = 0;
      local_8c = 1;
    }
    DynamicIntegerPointsKdTreeEncoder<1>::~DynamicIntegerPointsKdTreeEncoder(pDStack_1e20);
    goto joined_r0x00224f44;
  case '\x02':
    DynamicIntegerPointsKdTreeEncoder<2>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<2> *)
               CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030),
               in_stack_ffffffffffffe02c);
    PointDVector<unsigned_int>::begin((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    PointDVector<unsigned_int>::end((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    begin_03.item_._4_4_ = in_stack_ffffffffffffdfa4;
    begin_03.item_._0_4_ = in_stack_ffffffffffffdfa0;
    begin_03.vec_._0_4_ = in_stack_ffffffffffffdfa8;
    begin_03.vec_._4_4_ = in_stack_ffffffffffffdfac;
    begin_03.dimensionality_ = in_stack_ffffffffffffdfb0;
    begin_03._20_4_ = in_stack_ffffffffffffdfb4;
    end_03.item_._4_4_ = in_stack_ffffffffffffdfbc;
    end_03.item_._0_4_ = in_stack_ffffffffffffdfb8;
    end_03.vec_ = (PointDVector<unsigned_int> *)in_stack_ffffffffffffdfc0;
    end_03.dimensionality_ = in_stack_ffffffffffffdfc8.value_;
    end_03._20_4_ = in_stack_ffffffffffffdfcc;
    bVar2 = DynamicIntegerPointsKdTreeEncoder<2>::
            EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      ((DynamicIntegerPointsKdTreeEncoder<2> *)in_stack_ffffffffffffdf88,begin_03,
                       end_03,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80.value_),
                       (EncoderBuffer *)in_stack_ffffffffffffdf78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8c = 0x14;
    }
    else {
      local_1 = 0;
      local_8c = 1;
    }
    DynamicIntegerPointsKdTreeEncoder<2>::~DynamicIntegerPointsKdTreeEncoder(pDStack_1ce0);
joined_r0x00224f44:
    if (local_8c != 0x14) goto LAB_002251b1;
    goto LAB_0022519e;
  case '\x03':
    DynamicIntegerPointsKdTreeEncoder<3>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<3> *)
               CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030),
               in_stack_ffffffffffffe02c);
    PointDVector<unsigned_int>::begin((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    PointDVector<unsigned_int>::end((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    begin_02.item_._4_4_ = in_stack_ffffffffffffdfa4;
    begin_02.item_._0_4_ = in_stack_ffffffffffffdfa0;
    begin_02.vec_._0_4_ = in_stack_ffffffffffffdfa8;
    begin_02.vec_._4_4_ = in_stack_ffffffffffffdfac;
    begin_02.dimensionality_ = in_stack_ffffffffffffdfb0;
    begin_02._20_4_ = in_stack_ffffffffffffdfb4;
    end_02.item_._4_4_ = in_stack_ffffffffffffdfbc;
    end_02.item_._0_4_ = in_stack_ffffffffffffdfb8;
    end_02.vec_ = (PointDVector<unsigned_int> *)in_stack_ffffffffffffdfc0;
    end_02.dimensionality_ = in_stack_ffffffffffffdfc8.value_;
    end_02._20_4_ = in_stack_ffffffffffffdfcc;
    bVar2 = DynamicIntegerPointsKdTreeEncoder<3>::
            EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      ((DynamicIntegerPointsKdTreeEncoder<3> *)in_stack_ffffffffffffdf88,begin_02,
                       end_02,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80.value_),
                       (EncoderBuffer *)in_stack_ffffffffffffdf78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8c = 0x14;
    }
    else {
      local_1 = 0;
      local_8c = 1;
    }
    DynamicIntegerPointsKdTreeEncoder<3>::~DynamicIntegerPointsKdTreeEncoder(pDStack_1b88);
    break;
  case '\x04':
    DynamicIntegerPointsKdTreeEncoder<4>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<4> *)
               CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030),
               in_stack_ffffffffffffe02c);
    PointDVector<unsigned_int>::begin((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    PointDVector<unsigned_int>::end((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    begin_01.item_._4_4_ = in_stack_ffffffffffffdfa4;
    begin_01.item_._0_4_ = in_stack_ffffffffffffdfa0;
    begin_01.vec_._0_4_ = in_stack_ffffffffffffdfa8;
    begin_01.vec_._4_4_ = in_stack_ffffffffffffdfac;
    begin_01.dimensionality_ = in_stack_ffffffffffffdfb0;
    begin_01._20_4_ = in_stack_ffffffffffffdfb4;
    end_01.item_._4_4_ = in_stack_ffffffffffffdfbc;
    end_01.item_._0_4_ = in_stack_ffffffffffffdfb8;
    end_01.vec_ = (PointDVector<unsigned_int> *)in_stack_ffffffffffffdfc0;
    end_01.dimensionality_ = in_stack_ffffffffffffdfc8.value_;
    end_01._20_4_ = in_stack_ffffffffffffdfcc;
    bVar2 = DynamicIntegerPointsKdTreeEncoder<4>::
            EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      ((DynamicIntegerPointsKdTreeEncoder<4> *)in_stack_ffffffffffffdf88,begin_01,
                       end_01,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80.value_),
                       (EncoderBuffer *)in_stack_ffffffffffffdf78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8c = 0x14;
    }
    else {
      local_1 = 0;
      local_8c = 1;
    }
    DynamicIntegerPointsKdTreeEncoder<4>::~DynamicIntegerPointsKdTreeEncoder(pDStack_1a30);
    break;
  case '\x05':
    DynamicIntegerPointsKdTreeEncoder<5>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<5> *)
               CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030),
               in_stack_ffffffffffffe02c);
    PointDVector<unsigned_int>::begin((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    PointDVector<unsigned_int>::end((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    begin_00.item_._4_4_ = in_stack_ffffffffffffdfa4;
    begin_00.item_._0_4_ = in_stack_ffffffffffffdfa0;
    begin_00.vec_._0_4_ = in_stack_ffffffffffffdfa8;
    begin_00.vec_._4_4_ = in_stack_ffffffffffffdfac;
    begin_00.dimensionality_ = in_stack_ffffffffffffdfb0;
    begin_00._20_4_ = in_stack_ffffffffffffdfb4;
    end_00.item_._4_4_ = in_stack_ffffffffffffdfbc;
    end_00.item_._0_4_ = in_stack_ffffffffffffdfb8;
    end_00.vec_ = (PointDVector<unsigned_int> *)in_stack_ffffffffffffdfc0;
    end_00.dimensionality_ = in_stack_ffffffffffffdfc8.value_;
    end_00._20_4_ = in_stack_ffffffffffffdfcc;
    bVar2 = DynamicIntegerPointsKdTreeEncoder<5>::
            EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      ((DynamicIntegerPointsKdTreeEncoder<5> *)in_stack_ffffffffffffdf88,begin_00,
                       end_00,(uint32_t *)
                              CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80.value_),
                       (EncoderBuffer *)in_stack_ffffffffffffdf78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8c = 0x14;
    }
    else {
      local_1 = 0;
      local_8c = 1;
    }
    DynamicIntegerPointsKdTreeEncoder<5>::~DynamicIntegerPointsKdTreeEncoder(pDStack_11d8);
    break;
  case '\x06':
    DynamicIntegerPointsKdTreeEncoder<6>::DynamicIntegerPointsKdTreeEncoder
              ((DynamicIntegerPointsKdTreeEncoder<6> *)
               CONCAT44(in_stack_ffffffffffffe034,in_stack_ffffffffffffe030),
               in_stack_ffffffffffffe02c);
    PointDVector<unsigned_int>::begin((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    PointDVector<unsigned_int>::end((PointDVector<unsigned_int> *)in_stack_ffffffffffffdf10);
    begin.item_._4_4_ = in_stack_ffffffffffffdfa4;
    begin.item_._0_4_ = in_stack_ffffffffffffdfa0;
    begin.vec_._0_4_ = in_stack_ffffffffffffdfa8;
    begin.vec_._4_4_ = in_stack_ffffffffffffdfac;
    begin.dimensionality_ = in_stack_ffffffffffffdfb0;
    begin._20_4_ = in_stack_ffffffffffffdfb4;
    end.item_._4_4_ = in_stack_ffffffffffffdfbc;
    end.item_._0_4_ = in_stack_ffffffffffffdfb8;
    end.vec_ = (PointDVector<unsigned_int> *)in_stack_ffffffffffffdfc0;
    end.dimensionality_ = in_stack_ffffffffffffdfc8.value_;
    end._20_4_ = in_stack_ffffffffffffdfcc;
    bVar2 = DynamicIntegerPointsKdTreeEncoder<6>::
            EncodePoints<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                      (in_stack_ffffffffffffdf88,begin,end,
                       (uint32_t *)
                       CONCAT44(in_stack_ffffffffffffdf84,in_stack_ffffffffffffdf80.value_),
                       (EncoderBuffer *)in_stack_ffffffffffffdf78);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_8c = 0x14;
    }
    else {
      local_1 = 0;
      local_8c = 1;
    }
    DynamicIntegerPointsKdTreeEncoder<6>::~DynamicIntegerPointsKdTreeEncoder(pDStack_980);
    break;
  default:
    local_1 = 0;
    local_8c = 1;
    goto LAB_002251b1;
  }
  if (local_8c == 0x14) {
LAB_0022519e:
    local_1 = 1;
    local_8c = 1;
  }
LAB_002251b1:
  PointDVector<unsigned_int>::~PointDVector((PointDVector<unsigned_int> *)0x2251be);
  return (bool)(local_1 & 1);
}

Assistant:

bool KdTreeAttributesEncoder::EncodePortableAttributes(
    EncoderBuffer *out_buffer) {
  // Encode the data using the kd tree encoder algorithm. The data is first
  // copied to a PointDVector that provides all the API expected by the core
  // encoding algorithm.

  // We limit the maximum value of compression_level to 6 as we don't currently
  // have viable algorithms for higher compression levels.
  uint8_t compression_level =
      std::min(10 - encoder()->options()->GetSpeed(), 6);
  DRACO_DCHECK_LE(compression_level, 6);

  if (compression_level == 6 && num_components_ > 15) {
    // Don't use compression level for CL >= 6. Axis selection is currently
    // encoded using 4 bits.
    compression_level = 5;
  }

  out_buffer->Encode(compression_level);

  // Init PointDVector. The number of dimensions is equal to the total number
  // of dimensions across all attributes.
  const int num_points = encoder()->point_cloud()->num_points();
  PointDVector<uint32_t> point_vector(num_points, num_components_);

  int num_processed_components = 0;
  int num_processed_quantized_attributes = 0;
  int num_processed_signed_components = 0;
  // Copy data to the point vector.
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int att_id = GetAttributeId(i);
    const PointAttribute *const att =
        encoder()->point_cloud()->attribute(att_id);
    const PointAttribute *source_att = nullptr;
    if (att->data_type() == DT_UINT32 || att->data_type() == DT_UINT16 ||
        att->data_type() == DT_UINT8 || att->data_type() == DT_INT32 ||
        att->data_type() == DT_INT16 || att->data_type() == DT_INT8) {
      // Use the original attribute.
      source_att = att;
    } else if (att->data_type() == DT_FLOAT32) {
      // Use the portable (quantized) attribute instead.
      source_att =
          quantized_portable_attributes_[num_processed_quantized_attributes]
              .get();
      num_processed_quantized_attributes++;
    } else {
      // Unsupported data type.
      return false;
    }

    if (source_att == nullptr) {
      return false;
    }

    // Copy source_att to the vector.
    if (source_att->data_type() == DT_UINT32) {
      // If the data type is the same as the one used by the point vector, we
      // can directly copy individual elements.
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        const uint8_t *const att_value_address = source_att->GetAddress(avi);
        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   att_value_address);
      }
    } else if (source_att->data_type() == DT_INT32 ||
               source_att->data_type() == DT_INT16 ||
               source_att->data_type() == DT_INT8) {
      // Signed values need to be converted to unsigned before they are stored
      // in the point vector.
      std::vector<int32_t> signed_point(source_att->num_components());
      std::vector<uint32_t> unsigned_point(source_att->num_components());
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        source_att->ConvertValue<int32_t>(avi, &signed_point[0]);
        for (int c = 0; c < source_att->num_components(); ++c) {
          unsigned_point[c] =
              signed_point[c] -
              min_signed_values_[num_processed_signed_components + c];
        }

        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   &unsigned_point[0]);
      }
      num_processed_signed_components += source_att->num_components();
    } else {
      // If the data type of the attribute is different, we have to convert the
      // value before we put it to the point vector.
      std::vector<uint32_t> point(source_att->num_components());
      for (PointIndex pi(0); pi < num_points; ++pi) {
        const AttributeValueIndex avi = source_att->mapped_index(pi);
        source_att->ConvertValue<uint32_t>(avi, &point[0]);
        point_vector.CopyAttribute(source_att->num_components(),
                                   num_processed_components, pi.value(),
                                   point.data());
      }
    }
    num_processed_components += source_att->num_components();
  }

  // Compute the maximum bit length needed for the kd tree encoding.
  int num_bits = 0;
  const uint32_t *data = point_vector[0];
  for (int i = 0; i < num_points * num_components_; ++i) {
    if (data[i] > 0) {
      const int msb = MostSignificantBit(data[i]) + 1;
      if (msb > num_bits) {
        num_bits = msb;
      }
    }
  }

  switch (compression_level) {
    case 6: {
      DynamicIntegerPointsKdTreeEncoder<6> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 5: {
      DynamicIntegerPointsKdTreeEncoder<5> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 4: {
      DynamicIntegerPointsKdTreeEncoder<4> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 3: {
      DynamicIntegerPointsKdTreeEncoder<3> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 2: {
      DynamicIntegerPointsKdTreeEncoder<2> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 1: {
      DynamicIntegerPointsKdTreeEncoder<1> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    case 0: {
      DynamicIntegerPointsKdTreeEncoder<0> points_encoder(num_components_);
      if (!points_encoder.EncodePoints(point_vector.begin(), point_vector.end(),
                                       num_bits, out_buffer)) {
        return false;
      }
      break;
    }
    // Compression level and/or encoding speed seem wrong.
    default:
      return false;
  }
  return true;
}